

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-dt-erector.cpp
# Opt level: O2

Up __thiscall
yactfr::internal::PseudoDtErector::_pseudoDtFromOptType
          (PseudoDtErector *this,JsonObjVal *jsonDt,Up *attrs)

{
  Index IVar1;
  JsonVal *this_00;
  JsonArrayVal *this_01;
  Index *in_RCX;
  JsonArrayVal *jsonArrayVal;
  TextLocation *__args_3;
  PseudoDataLoc pseudoSelLoc;
  undefined1 local_c8 [8];
  _Head_base<0UL,_yactfr::internal::PseudoDt_*,_false> local_c0;
  __node_base local_b8;
  _Hash_node_base *local_b0;
  _Rb_tree<yactfr::IntegerRange<unsigned_long_long,_false>,_yactfr::IntegerRange<unsigned_long_long,_false>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_false>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_false>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_false>_>_>
  local_a8;
  undefined1 local_78 [16];
  PseudoDataLoc local_68;
  
  std::__cxx11::string::string((string *)&local_a8,"selector-field-location",(allocator *)&local_c0)
  ;
  anon_unknown_2::pseudoDataLocOfDynDt(&local_68,(JsonObjVal *)attrs,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_a8,"field-class",(allocator *)&local_c0);
  pseudoDtOfJsonObj((PseudoDtErector *)local_c8,jsonDt,(string *)attrs);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_a8,"selector-field-ranges",(allocator *)&local_c0);
  this_00 = MapItemMixin<yactfr::internal::JsonVal>::_tryAt
                      ((MapItemMixin<yactfr::internal::JsonVal> *)(attrs + 5),(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  IVar1 = *in_RCX;
  if (this_00 == (JsonVal *)0x0) {
    __args_3 = (TextLocation *)(local_78 + 8);
    *in_RCX = 0;
    local_b0 = (_Hash_node_base *)local_c8;
    local_c8 = (undefined1  [8])0x0;
    local_78._8_8_ = IVar1;
    std::
    make_unique<yactfr::internal::PseudoOptWithBoolSelType,std::unique_ptr<yactfr::internal::PseudoDt,std::default_delete<yactfr::internal::PseudoDt>>,yactfr::internal::PseudoDataLoc,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>,yactfr::TextLocation_const&>
              ((unique_ptr<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
                *)&local_a8,(PseudoDataLoc *)&local_b0,
               (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               &local_68,__args_3);
    (this->_aliases)._M_h._M_buckets = (__buckets_ptr)local_a8._M_impl._0_8_;
    if (local_b0 != (_Hash_node_base *)0x0) {
      (*(code *)local_b0->_M_nxt[1]._M_nxt)();
    }
    local_b0 = (_Hash_node_base *)0x0;
  }
  else {
    *in_RCX = 0;
    local_b8._M_nxt = (_Hash_node_base *)local_c8;
    local_c8 = (undefined1  [8])0x0;
    local_78._0_8_ = IVar1;
    this_01 = JsonVal::asArray(this_00);
    intRangesFromArray<unsigned_long_long,false>
              ((IntegerRangeSet<unsigned_long_long,_false> *)&local_a8,(internal *)this_01,
               jsonArrayVal);
    __args_3 = (TextLocation *)local_78;
    std::
    make_unique<yactfr::internal::PseudoOptWithIntSelType,std::unique_ptr<yactfr::internal::PseudoDt,std::default_delete<yactfr::internal::PseudoDt>>,yactfr::internal::PseudoDataLoc,yactfr::IntegerRangeSet<unsigned_long_long,false>,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>,yactfr::TextLocation_const&>
              ((unique_ptr<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
                *)&local_c0,(PseudoDataLoc *)&local_b8,
               (IntegerRangeSet<unsigned_long_long,_false> *)&local_68,
               (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               &local_a8,__args_3);
    (this->_aliases)._M_h._M_buckets = (__buckets_ptr)local_c0._M_head_impl;
    local_c0._M_head_impl = (PseudoDt *)0x0;
    std::
    _Rb_tree<yactfr::IntegerRange<unsigned_long_long,_false>,_yactfr::IntegerRange<unsigned_long_long,_false>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_false>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_false>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_false>_>_>
    ::~_Rb_tree(&local_a8);
    if (local_b8._M_nxt != (_Hash_node_base *)0x0) {
      (*(code *)(local_b8._M_nxt)->_M_nxt[1]._M_nxt)();
    }
    local_b8._M_nxt = (_Hash_node_base *)0x0;
  }
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             __args_3);
  if (local_c8 != (undefined1  [8])0x0) {
    (*(code *)(*(__node_base_ptr *)local_c8)[1]._M_nxt)();
  }
  std::
  vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_68._pathElems);
  return (__uniq_ptr_data<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>,_true,_true>
          )(__uniq_ptr_data<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>,_true,_true>
            )this;
}

Assistant:

PseudoDt::Up PseudoDtErector::_pseudoDtFromOptType(const JsonObjVal& jsonDt, MapItem::Up attrs)
{
    // selector location
    auto pseudoSelLoc = pseudoDataLocOfDynDt(jsonDt, strs::selFieldLoc);

    // data type
    auto pseudoDt = call([this, &jsonDt] {
        try {
            return this->pseudoDtOfJsonObj(jsonDt, strs::fc);
        } catch (TextParseError& exc) {
            appendMsgToTextParseError(exc, "In optional type:", jsonDt.loc());
            throw;
        }
    });

    // selector field ranges (presence indicates which kind of optional FC)
    if (const auto jsonSelFieldRanges = jsonDt[strs::selFieldRanges]) {
        return pseudoDtFromOptWithIntSelType(jsonDt, std::move(attrs), std::move(pseudoSelLoc),
                                             std::move(pseudoDt), jsonSelFieldRanges->asArray());
    } else {
        return pseudoDtFromOptWithBoolSelType(jsonDt, std::move(attrs),
                                              std::move(pseudoSelLoc), std::move(pseudoDt));
    }
}